

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  uint uVar1;
  ImGuiSortDirection IVar2;
  ImGuiTableColumn *pIVar3;
  long in_RDI;
  ImGuiTableColumn *column_1;
  int column_n_3;
  int column_n_2;
  int column_n_1;
  int column_with_smallest_sort_order;
  int sort_n;
  ImU64 fixed_mask;
  bool need_fix_single_sort_order;
  bool need_fix_linearize;
  ImGuiTableColumn *column;
  int column_n;
  ImU64 sort_order_mask;
  int sort_order_count;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint uVar4;
  ImGuiTableColumn *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  int local_1c;
  ulong local_18;
  int local_c;
  
  if ((*(uint *)(in_RDI + 4) & 8) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Sortable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xa31,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
  }
  local_c = 0;
  local_18 = 0;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x6c); local_1c = local_1c + 1) {
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if ((pIVar3->SortOrder != -1) && ((pIVar3->IsEnabled & 1U) == 0)) {
      pIVar3->SortOrder = -1;
    }
    if (pIVar3->SortOrder != -1) {
      local_c = local_c + 1;
      local_18 = 1L << (pIVar3->SortOrder & 0x3fU) | local_18;
      if (0x3f < local_c) {
        __assert_fail("sort_order_count < (int)sizeof(sort_order_mask) * 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0xa3f,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
    }
  }
  uVar4 = in_stack_ffffffffffffffa4 & 0xffffff;
  if (1 < local_c) {
    uVar4 = CONCAT13((*(uint *)(in_RDI + 4) & 0x4000000) != 0,(int3)in_stack_ffffffffffffffa4) ^
            0xff000000;
  }
  uVar1 = uVar4 & 0x1000000;
  if ((1L << ((byte)local_c & 0x3f) != local_18 + 1) || ((uVar4 & 0x1000000) != 0)) {
    local_38 = 0;
    local_3c = 0;
LAB_00242788:
    if (local_3c < local_c) {
      local_40 = -1;
      for (local_44 = 0; iVar5 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
          local_44 < *(int *)(in_RDI + 0x6c); local_44 = local_44 + 1) {
        if (((local_38 & 1L << ((byte)local_44 & 0x3f)) == 0) &&
           (pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),iVar5)
           , pIVar3->SortOrder != -1)) {
          if (local_40 != -1) {
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
            in_stack_ffffffffffffffa0 = (int)pIVar3->SortOrder;
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
            if (pIVar3->SortOrder <= in_stack_ffffffffffffffa0) goto LAB_0024283d;
          }
          local_40 = local_44;
        }
LAB_0024283d:
      }
      if (local_40 == -1) {
        __assert_fail("column_with_smallest_sort_order != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0xa50,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
      local_38 = 1L << ((byte)local_40 & 0x3f) | local_38;
      in_stack_ffffffffffffff9c = CONCAT13((char)local_3c,(int3)in_stack_ffffffffffffff9c);
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),iVar5);
      pIVar3->SortOrder = (ImGuiTableColumnIdx)((uint)in_stack_ffffffffffffff9c >> 0x18);
      if (uVar1 == 0) goto LAB_00242908;
      local_c = 1;
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x6c); local_48 = local_48 + 1) {
        if (local_48 != local_40) {
          pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                             ((ImSpan<ImGuiTableColumn> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
          pIVar3->SortOrder = -1;
        }
      }
    }
  }
  if ((local_c == 0) && ((*(uint *)(in_RDI + 4) & 0x8000000) == 0)) {
    for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x6c); iVar5 = iVar5 + 1) {
      in_stack_ffffffffffffffa8 =
           ImSpan<ImGuiTableColumn>::operator[]
                     ((ImSpan<ImGuiTableColumn> *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if (((in_stack_ffffffffffffffa8->IsEnabled & 1U) != 0) &&
         ((in_stack_ffffffffffffffa8->Flags & 0x100U) == 0)) {
        local_c = 1;
        in_stack_ffffffffffffffa8->SortOrder = '\0';
        IVar2 = TableGetColumnAvailSortDirection
                          ((ImGuiTableColumn *)CONCAT44(uVar4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
        in_stack_ffffffffffffffa8->field_0x64 =
             in_stack_ffffffffffffffa8->field_0x64 & 0xfc | (byte)IVar2 & 3;
        break;
      }
    }
  }
  *(char *)(in_RDI + 0x230) = (char)local_c;
  return;
LAB_00242908:
  local_3c = local_3c + 1;
  goto LAB_00242788;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}